

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitions.c
# Opt level: O3

size_t inform_next_partitioning(size_t *xs,size_t size)

{
  long lVar1;
  ulong uVar2;
  size_t i;
  size_t sVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (size < 2) {
    return 0;
  }
  lVar1 = size * 8;
  lVar5 = lVar1 + -8;
  if (lVar5 != 0) {
    lVar4 = 0;
    lVar6 = lVar1;
    do {
      uVar2 = *(ulong *)((long)xs + lVar5);
      lVar7 = lVar6;
      if (uVar2 < size - 1) {
        do {
          if (*(ulong *)((long)xs + lVar7 + -0x10) == uVar2) {
            *(ulong *)((long)xs + lVar5) = uVar2 + 1;
            if (lVar6 != lVar1) {
              memset((void *)(lVar6 + (long)xs),0,lVar4 << 3);
            }
            sVar3 = 0;
            uVar2 = 0;
            do {
              if (uVar2 < xs[sVar3] + 1) {
                uVar2 = xs[sVar3] + 1;
              }
              sVar3 = sVar3 + 1;
            } while (size != sVar3);
            return uVar2;
          }
          lVar7 = lVar7 + -8;
        } while (lVar7 != 8);
      }
      lVar4 = lVar4 + 1;
      lVar6 = lVar6 + -8;
      lVar5 = lVar5 + -8;
    } while (lVar5 != 0);
  }
  return 0;
}

Assistant:

size_t inform_next_partitioning(size_t *xs, size_t size)
{
    size_t n = 0;
    if (size > 1)
    {
        size_t *first = xs;
        size_t *last  = first + size;
        for (size_t *it = last - 1; it != first; --it)
        {
            if (*it < size - 1)
            {
                for (size_t *jt = it - 1; jt != first - 1; --jt)
                {
                    if (*jt == *it)
                    {
                        *it += 1;
                        for (size_t *kt = it + 1; kt != last; ++kt)
                        {
                            *kt = 0;
                        }
                        for (size_t i = 0; i < size; ++i)
                        {
                            n = (xs[i]+1 > n) ? xs[i]+1 : n;
                        }
                        return n;
                    }
                }
            }
        }
    }
    return n;
}